

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O0

void stealamulet(monst *mtmp)

{
  short sVar1;
  short sVar2;
  short sVar3;
  boolean bVar4;
  short sVar5;
  char *pcVar6;
  char *pcVar7;
  int fake;
  int real;
  obj *otmp;
  monst *mtmp_local;
  
  _fake = (obj *)0x0;
  sVar2 = 0;
  sVar3 = 0;
  if ((u.uhave._0_1_ & 1) == 0) {
    if ((((byte)u.uhave._0_1_ >> 4 & 1) == 0) ||
       (sVar1 = mtmp->mnum, sVar5 = quest_info(0x20), sVar1 != sVar5)) {
      if (((byte)u.uhave._0_1_ >> 1 & 1) == 0) {
        if (((byte)u.uhave._0_1_ >> 2 & 1) == 0) {
          if (((byte)u.uhave._0_1_ >> 3 & 1) == 0) {
            return;
          }
          sVar2 = 0x10b;
        }
        else {
          sVar2 = 0x1bd;
        }
      }
      else {
        sVar2 = 0x10c;
        sVar3 = 0x104;
      }
    }
    else {
      _fake = invent;
      while ((_fake != (obj *)0x0 && (bVar4 = is_quest_artifact(_fake), bVar4 == '\0'))) {
        _fake = _fake->nobj;
      }
      if (_fake == (obj *)0x0) {
        return;
      }
    }
  }
  else {
    sVar2 = 0xd9;
    sVar3 = 0xd8;
  }
  if (_fake == (obj *)0x0) {
    _fake = invent;
    while (((_fake != (obj *)0x0 && (_fake->otyp != sVar2)) &&
           ((_fake->otyp != sVar3 || ((*(uint *)&mtmp->field_0x60 >> 0x1d & 1) != 0))))) {
      _fake = _fake->nobj;
    }
  }
  if (_fake != (obj *)0x0) {
    if (_fake->owornmask != 0) {
      remove_worn_item(_fake,'\x01');
    }
    freeinv(_fake);
    mpickobj(mtmp,_fake);
    pcVar6 = Monnam(mtmp);
    pcVar7 = doname(_fake);
    pline("%s stole %s!",pcVar6,pcVar7);
    if (((mtmp->data->mflags1 & 0x2000000) != 0) && (bVar4 = tele_restrict(mtmp), bVar4 == '\0')) {
      rloc(level,mtmp,'\0');
    }
  }
  return;
}

Assistant:

void stealamulet(struct monst *mtmp)
{
    struct obj *otmp = NULL;
    int real=0, fake=0;

    /* select the artifact to steal */
    if (u.uhave.amulet) {
	real = AMULET_OF_YENDOR;
	fake = FAKE_AMULET_OF_YENDOR;
    } else if (u.uhave.questart && mtmp->mnum == quest_info(MS_NEMESIS)) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_quest_artifact(otmp)) break;
	if (!otmp) return;	/* should we panic instead? */
    } else if (u.uhave.bell) {
	real = BELL_OF_OPENING;
	fake = BELL;
    } else if (u.uhave.book) {
	real = SPE_BOOK_OF_THE_DEAD;
    } else if (u.uhave.menorah) {
	real = CANDELABRUM_OF_INVOCATION;
    } else return;	/* you have nothing of special interest */

    if (!otmp) {
	/* If we get here, real and fake have been set up. */
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (otmp->otyp == real || (otmp->otyp == fake && !mtmp->iswiz))
		break;
    }

    if (otmp) { /* we have something to snatch */
	if (otmp->owornmask)
	    remove_worn_item(otmp, TRUE);
	freeinv(otmp);
	/* mpickobj wont merge otmp because none of the above things
	   to steal are mergable */
	mpickobj(mtmp,otmp);	/* may merge and free otmp */
	pline("%s stole %s!", Monnam(mtmp), doname(otmp));
	if (can_teleport(mtmp->data) && !tele_restrict(mtmp))
	    rloc(level, mtmp, FALSE);
    }
}